

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void wavWrite_int16(char *filename,int16_t *buffer,int sampleRate,uint64_t totalSampleCount,
                   uint32_t channels)

{
  drwav *pWav;
  drwav_uint64 dVar1;
  drwav_data_format format;
  drwav_data_format local_34;
  
  local_34.container = drwav_container_riff;
  local_34.format = 1;
  local_34.bitsPerSample = 0x10;
  local_34.channels = channels;
  local_34.sampleRate = sampleRate;
  pWav = drwav_open_file_write__internal(filename,&local_34,0,0);
  if (pWav != (drwav *)0x0) {
    dVar1 = drwav_write(pWav,totalSampleCount,buffer);
    drwav_uninit(pWav);
    if (dVar1 != totalSampleCount) {
      wavWrite_int16_cold_1();
    }
  }
  return;
}

Assistant:

void wavWrite_int16(char *filename, int16_t *buffer, int sampleRate, uint64_t totalSampleCount, uint32_t channels) {
    drwav_data_format format;
    format.container = drwav_container_riff;
    format.format = DR_WAVE_FORMAT_PCM;
    format.channels = channels;
    format.sampleRate = (drwav_uint32) sampleRate;
    format.bitsPerSample = 16;

    drwav *pWav = drwav_open_file_write(filename, &format);
    if (pWav) {
        drwav_uint64 samplesWritten = drwav_write(pWav, totalSampleCount, buffer);
        drwav_uninit(pWav);
        if (samplesWritten != totalSampleCount) {
            fprintf(stderr, "write file [%s] error.\n", filename);
            exit(1);
        }
    }
}